

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

bool __thiscall QAction::event(QAction *this,QEvent *e)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  long lVar4;
  
  if (*(short *)(e + 8) == 0x71) {
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x150);
    if (lVar1 != 0) {
      lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x148);
      lVar4 = 0;
      do {
        QCoreApplication::sendEvent(*(QObject **)(lVar2 + lVar4),e);
        lVar4 = lVar4 + 8;
      } while (lVar1 << 3 != lVar4);
    }
  }
  if (*(short *)(e + 8) == 0x75) {
    if (e[0x1c] == (QEvent)0x1) {
      event((QAction *)e);
    }
    else {
      activate(this,Trigger);
    }
    return true;
  }
  uVar3 = QObject::event((QEvent *)this);
  return (bool)uVar3;
}

Assistant:

bool QAction::event(QEvent *e)
{
    Q_D(QAction);
    if (e->type() == QEvent::ActionChanged) {
        for (auto object : std::as_const(d->associatedObjects))
            QCoreApplication::sendEvent(object, e);
    }

#if QT_CONFIG(shortcut)
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        Q_ASSERT_X(d_func()->shortcutIds.contains(se->shortcutId()),
                   "QAction::event",
                   "Received shortcut event from incorrect shortcut");
        if (se->isAmbiguous())
            qWarning("QAction::event: Ambiguous shortcut overload: %s", se->key().toString(QKeySequence::NativeText).toLatin1().constData());
        else
            activate(Trigger);
        return true;
    }
#endif // QT_CONFIG(shortcut)
    return QObject::event(e);
}